

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O1

int Map_MatchNodePhase(Map_Man_t *p,Map_Node_t *pNode,int fPhase)

{
  Map_Super_t **ppMVar1;
  Map_Time_t *pMVar2;
  int iVar3;
  Map_Match_t *pMVar4;
  Map_Cut_t *pCut;
  long lVar5;
  Map_Cut_t *pCut_00;
  float fVar6;
  Map_Match_t MatchBest;
  Map_Match_t local_68;
  long local_38;
  
  lVar5 = (long)fPhase;
  pCut = pNode->pCutBest[lVar5];
  if (p->fMappingMode != 0 && pCut == (Map_Cut_t *)0x0) {
    return 1;
  }
  if (p->fMappingMode != 0) {
    Map_TimeCutComputeArrival(pNode,pCut,fPhase,3.4028235e+37);
  }
  if (p->fMappingMode - 2U < 2) {
    pMVar4 = pCut->M + lVar5;
    if ((pNode->nRefAct[lVar5] < 1) &&
       ((pNode->pCutBest[fPhase == 0] != (Map_Cut_t *)0x0 || (pNode->nRefAct[fPhase == 0] < 1)))) {
      fVar6 = Map_CutGetAreaDerefed(pCut,fPhase);
    }
    else {
      fVar6 = Map_CutDeref(pCut,fPhase,p->fUseProfile);
    }
  }
  else {
    if (p->fMappingMode != 4) goto LAB_003feb36;
    pMVar4 = pCut->M + lVar5;
    if ((pNode->nRefAct[lVar5] < 1) &&
       ((pNode->pCutBest[fPhase == 0] != (Map_Cut_t *)0x0 || (pNode->nRefAct[fPhase == 0] < 1)))) {
      fVar6 = Map_SwitchCutGetDerefed(pNode,pCut,fPhase);
    }
    else {
      fVar6 = Map_SwitchCutDeref(pNode,pCut,fPhase);
    }
  }
  pMVar4->AreaFlow = fVar6;
LAB_003feb36:
  if (pCut == (Map_Cut_t *)0x0) {
    local_68.pSuperBest = (Map_Super_t *)0x0;
    local_68.pSupers = (Map_Super_t *)0x0;
    local_68.uPhase = 0;
    local_68.uPhaseBest = 0;
    local_68.tArrive.Rise = 3.4028235e+37;
    local_68.tArrive.Fall = 3.4028235e+37;
    local_68.tArrive.Worst = 3.4028235e+37;
    local_68.AreaFlow = 3.4028235e+37;
  }
  else {
    local_68._32_8_ = *(undefined8 *)&pCut->M[lVar5].tArrive.Worst;
    pMVar4 = pCut->M + lVar5;
    local_68.pSupers = pMVar4->pSupers;
    local_68.uPhase = pMVar4->uPhase;
    local_68.uPhaseBest = pMVar4->uPhaseBest;
    ppMVar1 = &pCut->M[lVar5].pSuperBest;
    local_68.pSuperBest = *ppMVar1;
    pMVar2 = (Map_Time_t *)(ppMVar1 + 1);
    local_68.tArrive.Rise = pMVar2->Rise;
    local_68.tArrive.Fall = pMVar2->Fall;
  }
  pCut_00 = pNode->pCuts->pNext;
  local_38 = lVar5;
  if (pCut_00 != (Map_Cut_t *)0x0) {
    fVar6 = pNode->tRequired[lVar5].Worst;
    do {
      if (((p->fSkipFanout == 0) ||
          (((pNode->nRefs < 4 || (pCut_00->nLeaves < '\x03')) &&
           ((pNode->nRefs < 2 || (pCut_00->nLeaves < '\x04')))))) &&
         (pCut_00->M[lVar5].pSupers != (Map_Super_t *)0x0)) {
        pMVar4 = pCut_00->M + lVar5;
        Map_MatchNodeCut(p,pNode,pCut_00,fPhase,fVar6);
        if (((pMVar4->pSuperBest != (Map_Super_t *)0x0) &&
            ((pMVar4->tArrive).Worst <= p->fEpsilon + fVar6)) &&
           (iVar3 = Map_MatchCompare(p,&local_68,pMVar4,p->fMappingMode), iVar3 != 0)) {
          local_68._32_8_ = *(undefined8 *)&(pMVar4->tArrive).Worst;
          local_68.pSupers = pMVar4->pSupers;
          local_68.uPhase = pMVar4->uPhase;
          local_68.uPhaseBest = pMVar4->uPhaseBest;
          local_68.pSuperBest = pMVar4->pSuperBest;
          local_68.tArrive.Rise = (pMVar4->tArrive).Rise;
          local_68.tArrive.Fall = (pMVar4->tArrive).Fall;
          pCut = pCut_00;
          if (p->fMappingMode == 0) {
            fVar6 = local_68.tArrive.Worst;
          }
        }
      }
      pCut_00 = pCut_00->pNext;
    } while (pCut_00 != (Map_Cut_t *)0x0);
  }
  if (pCut != (Map_Cut_t *)0x0) {
    pNode->pCutBest[local_38] = pCut;
    *(undefined8 *)&pCut->M[local_38].tArrive.Worst = local_68._32_8_;
    ppMVar1 = &pCut->M[local_38].pSuperBest;
    *ppMVar1 = local_68.pSuperBest;
    pMVar2 = (Map_Time_t *)(ppMVar1 + 1);
    pMVar2->Rise = local_68.tArrive.Rise;
    pMVar2->Fall = local_68.tArrive.Fall;
    pMVar4 = pCut->M + local_38;
    pMVar4->pSupers = local_68.pSupers;
    pMVar4->uPhase = local_68.uPhase;
    pMVar4->uPhaseBest = local_68.uPhaseBest;
    iVar3 = p->fMappingMode;
    if ((1 < iVar3) &&
       ((0 < pNode->nRefAct[local_38] ||
        ((pNode->pCutBest[fPhase == 0] == (Map_Cut_t *)0x0 && (0 < pNode->nRefAct[fPhase == 0]))))))
    {
      if (iVar3 - 2U < 2) {
        Map_CutRef(pNode->pCutBest[local_38],fPhase,p->fUseProfile);
      }
      else {
        if (iVar3 != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperMatch.c"
                        ,0x15e,"int Map_MatchNodePhase(Map_Man_t *, Map_Node_t *, int)");
        }
        Map_SwitchCutRef(pNode,pNode->pCutBest[local_38],fPhase);
      }
    }
  }
  return 1;
}

Assistant:

int Map_MatchNodePhase( Map_Man_t * p, Map_Node_t * pNode, int fPhase )
{
    Map_Match_t MatchBest, * pMatch;
    Map_Cut_t * pCut, * pCutBest;
    float Area1 = 0.0; // Suppress "might be used uninitialized
    float Area2, fWorstLimit;

    // skip the cuts that have been unassigned during area recovery
    pCutBest = pNode->pCutBest[fPhase];
    if ( p->fMappingMode != 0 && pCutBest == NULL )
        return 1;

    // recompute the arrival times of the current best match 
    // because the arrival times of the fanins may have changed 
    // as a result of remapping fanins in the topological order
    if ( p->fMappingMode != 0 )
    {
        Map_TimeCutComputeArrival( pNode, pCutBest, fPhase, MAP_FLOAT_LARGE );
        // make sure that the required times are met
//        assert( pCutBest->M[fPhase].tArrive.Rise < pNode->tRequired[fPhase].Rise + p->fEpsilon );
//        assert( pCutBest->M[fPhase].tArrive.Fall < pNode->tRequired[fPhase].Fall + p->fEpsilon );
    }

    // recompute the exact area of the current best match
    // because the exact area of the fanins may have changed
    // as a result of remapping fanins in the topological order
    if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
    {
        pMatch = pCutBest->M + fPhase;
        if ( pNode->nRefAct[fPhase] > 0 || 
            (pNode->pCutBest[!fPhase] == NULL && pNode->nRefAct[!fPhase] > 0) )
            pMatch->AreaFlow = Area1 = Map_CutDeref( pCutBest, fPhase, p->fUseProfile );
        else
            pMatch->AreaFlow = Area1 = Map_CutGetAreaDerefed( pCutBest, fPhase );
    }
    else if ( p->fMappingMode == 4 )
    {
        pMatch = pCutBest->M + fPhase;
        if ( pNode->nRefAct[fPhase] > 0 || 
            (pNode->pCutBest[!fPhase] == NULL && pNode->nRefAct[!fPhase] > 0) )
            pMatch->AreaFlow = Area1 = Map_SwitchCutDeref( pNode, pCutBest, fPhase );
        else
            pMatch->AreaFlow = Area1 = Map_SwitchCutGetDerefed( pNode, pCutBest, fPhase );
    }

    // save the old mapping
    if ( pCutBest )
        MatchBest = pCutBest->M[fPhase];
    else
        Map_MatchClean( &MatchBest );
 
    // select the new best cut
    fWorstLimit = pNode->tRequired[fPhase].Worst;
    for ( pCut = pNode->pCuts->pNext; pCut; pCut = pCut->pNext )
    {
        // limit gate sizes based on fanout count
        if ( p->fSkipFanout && ((pNode->nRefs > 3 && pCut->nLeaves > 2) || (pNode->nRefs > 1 && pCut->nLeaves > 3)) )
            continue;
        pMatch = pCut->M + fPhase;
        if ( pMatch->pSupers == NULL )
            continue;

        // find the matches for the cut
        Map_MatchNodeCut( p, pNode, pCut, fPhase, fWorstLimit );
        if ( pMatch->pSuperBest == NULL || pMatch->tArrive.Worst > fWorstLimit + p->fEpsilon )
            continue;

        // if the cut can be matched compare the matchings
        if ( Map_MatchCompare( p, &MatchBest, pMatch, p->fMappingMode ) )
        {
            pCutBest  =  pCut;
            MatchBest = *pMatch;
            // if we are mapping for delay, the worst-case limit should be tightened
            if ( p->fMappingMode == 0 )
                fWorstLimit = MatchBest.tArrive.Worst;
        }
    }

    if ( pCutBest == NULL )
        return 1;

    // set the new mapping
    pNode->pCutBest[fPhase] = pCutBest;
    pCutBest->M[fPhase]     = MatchBest;

    // reference the new cut if it used
    if ( p->fMappingMode >= 2 && 
         (pNode->nRefAct[fPhase] > 0 || 
         (pNode->pCutBest[!fPhase] == NULL && pNode->nRefAct[!fPhase] > 0)) )
    {
        if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
            Area2 = Map_CutRef( pNode->pCutBest[fPhase], fPhase, p->fUseProfile );
        else if ( p->fMappingMode == 4 )
            Area2 = Map_SwitchCutRef( pNode, pNode->pCutBest[fPhase], fPhase );
        else 
            assert( 0 );
//        assert( Area2 < Area1 + p->fEpsilon );
    }

    // make sure that the requited times are met
//    assert( MatchBest.tArrive.Rise < pNode->tRequired[fPhase].Rise + p->fEpsilon );
//    assert( MatchBest.tArrive.Fall < pNode->tRequired[fPhase].Fall + p->fEpsilon );
    return 1;
}